

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall Fossilize::StreamArchive::prepare(StreamArchive *this)

{
  Impl *pIVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  bool bVar4;
  int iVar5;
  LogLevel LVar6;
  FILE *__stream;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  char *__modes;
  ulong uVar11;
  pointer __filename;
  ResourceTag tag;
  PayloadHeader header;
  uint64_t value;
  uint8_t magic [16];
  char local_b8 [8];
  char acStack_b0 [8];
  undefined1 local_a8;
  char local_98 [8];
  char acStack_90 [8];
  undefined1 local_88;
  ulong local_80;
  PayloadHeader local_78;
  char bytes_to_read [56];
  
  pIVar1 = (this->super_DatabaseInterface).impl;
  ppEVar2 = (pIVar1->imported_metadata).
            super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppEVar3 = (pIVar1->imported_metadata).
            super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)ppEVar2 - (long)ppEVar3) || this->mode != ReadOnly && ppEVar2 != ppEVar3) {
    return false;
  }
  switch(this->mode) {
  case Append:
    __stream = fopen((this->path)._M_dataplus._M_p,"r+b");
    this->file = (FILE *)__stream;
    if (__stream == (FILE *)0x0) goto switchD_0010853e_caseD_3;
    goto LAB_00108596;
  case ReadOnly:
    __filename = (this->path)._M_dataplus._M_p;
    __modes = "rb";
    break;
  case AppendWithReadOnlyAccess:
    goto switchD_0010853e_caseD_2;
  case OverWrite:
switchD_0010853e_caseD_3:
    __filename = (this->path)._M_dataplus._M_p;
    __modes = "wb";
    break;
  case ExclusiveOverWrite:
    __filename = (this->path)._M_dataplus._M_p;
    __modes = "wbx";
    break;
  default:
    __stream = (FILE *)this->file;
    goto LAB_0010858d;
  }
  __stream = fopen(__filename,__modes);
  this->file = (FILE *)__stream;
LAB_0010858d:
  if (__stream == (FILE *)0x0) {
switchD_0010853e_caseD_2:
    return false;
  }
LAB_00108596:
  pIVar1 = (this->super_DatabaseInterface).impl;
  ppEVar2 = (pIVar1->imported_metadata).
            super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar2 ==
      (pIVar1->imported_metadata).
      super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (1 < this->mode - OverWrite) {
      iVar5 = fileno(__stream);
      iVar5 = posix_fadvise(iVar5,0,0,2);
      if (((iVar5 != 0) && (LVar6 = get_thread_log_level(), (int)LVar6 < 2)) &&
         (bVar4 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n"
                            ), !bVar4)) {
        fwrite("Fossilize WARN: Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n"
               ,0x6a,1,_stderr);
      }
      fseek((FILE *)this->file,0,2);
      uVar7 = ftell((FILE *)this->file);
      rewind((FILE *)this->file);
      if ((uVar7 != 0) && ((shutdown_requested & 1) == 0)) {
        sVar8 = fread(magic,1,0x10,(FILE *)this->file);
        if (sVar8 != 0x10) {
          return false;
        }
        iVar5 = bcmp(magic,&stream_reference_magic_and_version,0xf);
        if (iVar5 != 0) {
          return false;
        }
        if ((byte)(magic[0xf] - 7) < 0xfe) {
          return false;
        }
        uVar9 = 0x10;
        uVar11 = uVar7;
        while (uVar10 = uVar9, uVar9 < uVar7) {
          if ((shutdown_requested & 1) != 0) {
            return false;
          }
          header.payload_size = 0;
          header.format = 0;
          header.crc = 0;
          header.uncompressed_size = 0;
          uVar10 = uVar9 + 0x38;
          uVar11 = uVar9;
          if (uVar7 < uVar10) {
            LVar6 = get_thread_log_level();
            uVar10 = uVar9;
            if ((int)LVar6 < 2) {
              bVar4 = Internal::log_thread_callback
                                (LOG_DEFAULT,"Detected sliced file. Dropping entries from here.\n");
LAB_001088a7:
              if (bVar4 == false) {
                fwrite("Fossilize WARN: Detected sliced file. Dropping entries from here.\n",0x42,1,
                       _stderr);
              }
            }
            break;
          }
          sVar8 = fread(bytes_to_read,1,0x38,(FILE *)this->file);
          if (sVar8 != 0x38) {
            return false;
          }
          convert_from_le(&header,(PayloadHeaderRaw *)(bytes_to_read + 0x28));
          if (uVar7 < (header._0_8_ & 0xffffffff) + uVar10) {
            LVar6 = get_thread_log_level();
            if ((int)LVar6 < 2) {
              bVar4 = Internal::log_thread_callback
                                (LOG_DEFAULT,"Detected sliced file. Dropping entries from here.\n");
              goto LAB_001088a7;
            }
            break;
          }
          local_88 = 0;
          local_98[0] = bytes_to_read[8];
          local_98[1] = bytes_to_read[9];
          local_98[2] = bytes_to_read[10];
          local_98[3] = bytes_to_read[0xb];
          local_98[4] = bytes_to_read[0xc];
          local_98[5] = bytes_to_read[0xd];
          local_98[6] = bytes_to_read[0xe];
          local_98[7] = bytes_to_read[0xf];
          acStack_90[0] = bytes_to_read[0x10];
          acStack_90[1] = bytes_to_read[0x11];
          acStack_90[2] = bytes_to_read[0x12];
          acStack_90[3] = bytes_to_read[0x13];
          acStack_90[4] = bytes_to_read[0x14];
          acStack_90[5] = bytes_to_read[0x15];
          acStack_90[6] = bytes_to_read[0x16];
          acStack_90[7] = bytes_to_read[0x17];
          local_a8 = 0;
          local_b8[0] = bytes_to_read[0x18];
          local_b8[1] = bytes_to_read[0x19];
          local_b8[2] = bytes_to_read[0x1a];
          local_b8[3] = bytes_to_read[0x1b];
          local_b8[4] = bytes_to_read[0x1c];
          local_b8[5] = bytes_to_read[0x1d];
          local_b8[6] = bytes_to_read[0x1e];
          local_b8[7] = bytes_to_read[0x1f];
          acStack_b0[0] = bytes_to_read[0x20];
          acStack_b0[1] = bytes_to_read[0x21];
          acStack_b0[2] = bytes_to_read[0x22];
          acStack_b0[3] = bytes_to_read[0x23];
          acStack_b0[4] = bytes_to_read[0x24];
          acStack_b0[5] = bytes_to_read[0x25];
          acStack_b0[6] = bytes_to_read[0x26];
          acStack_b0[7] = bytes_to_read[0x27];
          uVar9 = strtoul(local_98,(char **)0x0,0x10);
          tag = (ResourceTag)uVar9;
          if (tag < RESOURCE_COUNT) {
            value = strtoull(local_b8,(char **)0x0,0x10);
            local_78.payload_size = header.payload_size;
            local_78.format = header.format;
            local_78.crc = header.crc;
            local_78.uncompressed_size = header.uncompressed_size;
            local_80 = uVar10;
            bVar4 = DatabaseInterface::test_resource_filter
                              (&this->super_DatabaseInterface,tag,value);
            if (bVar4) {
              std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<unsigned_long&,Fossilize::StreamArchive::Entry&>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)(this->seen_blobs +
                            (tag & (RESOURCE_APPLICATION_BLOB_LINK|RESOURCE_COMPUTE_PIPELINE))),
                         &value,&local_80);
            }
          }
          iVar5 = fseek((FILE *)this->file,header._0_8_ & 0xffffffff,1);
          if (iVar5 < 0) {
            return false;
          }
          uVar9 = uVar10 + (header._0_8_ & 0xffffffff);
        }
        if (((uVar10 != uVar7) && (this->mode == Append)) &&
           (iVar5 = fseek((FILE *)this->file,uVar11,0), iVar5 < 0)) {
          return false;
        }
        goto LAB_001086c5;
      }
      __stream = (FILE *)this->file;
    }
    sVar8 = fwrite(&stream_reference_magic_and_version,1,0x10,__stream);
    if (sVar8 != 0x10) {
      return false;
    }
  }
  else {
    this->imported_metadata = *ppEVar2;
    iVar5 = fileno(__stream);
    iVar5 = posix_fadvise(iVar5,0,0,1);
    if (((iVar5 != 0) && (LVar6 = get_thread_log_level(), (int)LVar6 < 2)) &&
       (bVar4 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n"
                          ), !bVar4)) {
      fwrite("Fossilize WARN: Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n"
             ,0x6a,1,_stderr);
    }
  }
LAB_001086c5:
  this->alive = true;
  return true;
}

Assistant:

bool prepare() override
	{
		if (!impl->imported_metadata.empty() && mode != DatabaseMode::ReadOnly)
			return false;
		if (impl->imported_metadata.size() > 1)
			return false;

		switch (mode)
		{
		case DatabaseMode::ReadOnly:
#if _WIN32
			{
				file = nullptr;
				int fd = _open(path.c_str(), _O_BINARY | _O_RDONLY |
				               (impl->imported_metadata.empty() ? _O_SEQUENTIAL : _O_RANDOM),
				               _S_IREAD);
				if (fd >= 0)
					file = _fdopen(fd, "rb");
			}
#else
			file = fopen(path.c_str(), "rb");
#endif
			break;

		case DatabaseMode::Append:
			file = fopen(path.c_str(), "r+b");
			// r+b on empty file does not seem to work on Windows, so just fall back to wb.
			if (!file)
				file = fopen(path.c_str(), "wb");
			break;

		case DatabaseMode::AppendWithReadOnlyAccess:
			return false;

		case DatabaseMode::OverWrite:
			file = fopen(path.c_str(), "wb");
			break;

		case DatabaseMode::ExclusiveOverWrite:
		{
#ifdef _WIN32
			file = nullptr;
			int fd = _open(path.c_str(), _O_BINARY | _O_WRONLY | _O_CREAT | _O_EXCL | _O_TRUNC | _O_SEQUENTIAL, _S_IWRITE | _S_IREAD);
			if (fd >= 0)
				file = _fdopen(fd, "wb");
#else
			file = fopen(path.c_str(), "wbx");
#endif
			break;
		}
		}

		if (!file)
			return false;

		if (!impl->imported_metadata.empty())
		{
			// Do nothing here. TODO: Set fadvise to RANDOM here.
			imported_metadata = impl->imported_metadata[0];
#ifdef __linux__
			// We're going to be doing scattered reads, which hopefully have been cached earlier.
			// However, if the archive has been paged out, RANDOM is the correct approach,
			// since prefetching data is only detrimental.
			if (posix_fadvise(fileno(file), 0, 0, POSIX_FADV_RANDOM) != 0)
				LOGW_LEVEL("Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n");
#endif
		}
		else if (mode != DatabaseMode::OverWrite && mode != DatabaseMode::ExclusiveOverWrite)
		{
#if _WIN32
			if (mode == DatabaseMode::ReadOnly)
			{
				// Set the buffer size to reduce I/O cost of sparse freads
				setvbuf(file, nullptr, _IOFBF, FOSSILIZE_BLOB_HASH_LENGTH + sizeof(PayloadHeaderRaw));
			}
#endif

#ifdef __linux__
			// We're going to scan through the archive sequentially to discover metadata, so some prefetching is welcome.
			if (posix_fadvise(fileno(file), 0, 0, POSIX_FADV_SEQUENTIAL) != 0)
				LOGW_LEVEL("Failed to advise of file usage. This is not fatal, but might compromise disk performance.\n");
#endif

			// Scan through the archive and get the list of files.
			fseek(file, 0, SEEK_END);
			size_t len = ftell(file);
			rewind(file);

			if (len != 0 && !shutdown_requested.load(std::memory_order_relaxed))
			{
				uint8_t magic[MagicSize];
				if (fread(magic, 1, MagicSize, file) != MagicSize)
					return false;

				if (memcmp(magic, stream_reference_magic_and_version, MagicSize - 1))
					return false;
				int version = magic[MagicSize - 1];
				if (version > FOSSILIZE_FORMAT_VERSION || version < FOSSILIZE_FORMAT_MIN_COMPAT_VERSION)
					return false;

				size_t offset = MagicSize;
				size_t begin_append_offset = len;

				while (offset < len)
				{
					if (shutdown_requested.load(std::memory_order_relaxed))
						return false;

					begin_append_offset = offset;

					PayloadHeaderRaw *header_raw = nullptr;
					char bytes_to_read[FOSSILIZE_BLOB_HASH_LENGTH + sizeof(PayloadHeaderRaw)];
					PayloadHeader header = {};

					// Corrupt entry. Our process might have been killed before we could write all data.
					if (offset + sizeof(bytes_to_read) > len)
					{
						LOGW_LEVEL("Detected sliced file. Dropping entries from here.\n");
						break;
					}

					// NAME + HEADER in one read
					if (fread(bytes_to_read, 1, sizeof(bytes_to_read), file) != sizeof(bytes_to_read))
						return false;
					offset += sizeof(bytes_to_read);
					header_raw = (PayloadHeaderRaw*)&bytes_to_read[FOSSILIZE_BLOB_HASH_LENGTH];
					convert_from_le(header, *header_raw);

					// Corrupt entry. Our process might have been killed before we could write all data.
					if (offset + header.payload_size > len)
					{
						LOGW_LEVEL("Detected sliced file. Dropping entries from here.\n");
						break;
					}

					char tag_str[16 + 1] = {};
					char value_str[16 + 1] = {};
					memcpy(tag_str, bytes_to_read + FOSSILIZE_BLOB_HASH_LENGTH - 32, 16);
					memcpy(value_str, bytes_to_read + FOSSILIZE_BLOB_HASH_LENGTH - 16, 16);

					auto tag = unsigned(strtoul(tag_str, nullptr, 16));
					if (tag < RESOURCE_COUNT)
					{
						uint64_t value = strtoull(value_str, nullptr, 16);
						Entry entry = {};
						entry.header = header;
						entry.offset = offset;
						if (test_resource_filter(static_cast<ResourceTag>(tag), value))
							seen_blobs[tag].emplace(value, entry);
					}

					if (fseek(file, header.payload_size, SEEK_CUR) < 0)
						return false;

					offset += header.payload_size;
				}

				if (mode == DatabaseMode::Append && offset != len)
				{
					if (fseek(file, begin_append_offset, SEEK_SET) < 0)
						return false;
				}
			}
			else
			{
				// Appending to a fresh file. Make sure we have the magic.
				if (fwrite(stream_reference_magic_and_version, 1,
				           sizeof(stream_reference_magic_and_version), file) != sizeof(stream_reference_magic_and_version))
					return false;
			}
		}
		else
		{
			if (fwrite(stream_reference_magic_and_version, 1, sizeof(stream_reference_magic_and_version), file) !=
			    sizeof(stream_reference_magic_and_version))
			{
				return false;
			}
		}

		alive = true;
		return true;
	}